

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
tfnw::TransferFunctionWidget::get_colormapf
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          TransferFunctionWidget *this)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  reference pvVar4;
  ulong local_40;
  size_t i;
  allocator<float> local_21;
  value_type_conflict1 local_20;
  undefined1 local_19;
  TransferFunctionWidget *local_18;
  TransferFunctionWidget *this_local;
  vector<float,_std::allocator<float>_> *colormapf;
  
  this->colormap_changed = false;
  local_19 = 0;
  local_18 = this;
  this_local = (TransferFunctionWidget *)__return_storage_ptr__;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->current_colormap);
  local_20 = 0.0;
  std::allocator<float>::allocator(&local_21);
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,sVar2,&local_20,&local_21);
  std::allocator<float>::~allocator(&local_21);
  for (local_40 = 0;
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->current_colormap), local_40 < sVar2; local_40 = local_40 + 1) {
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->current_colormap,local_40);
    bVar1 = *pbVar3;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,local_40)
    ;
    *pvVar4 = (float)bVar1 / 255.0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> TransferFunctionWidget::get_colormapf()
{
    colormap_changed = false;
    std::vector<float> colormapf(current_colormap.size(), 0.f);
    for (size_t i = 0; i < current_colormap.size(); ++i) {
        colormapf[i] = current_colormap[i] / 255.f;
    }
    return colormapf;
}